

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# share.c
# Opt level: O3

CURLSHcode curl_share_cleanup(Curl_share *share)

{
  CURLSHcode CVar1;
  Curl_ssl_session *pCVar2;
  long lVar3;
  ulong uVar4;
  
  CVar1 = CURLSHE_INVALID;
  if ((share != (Curl_share *)0x0) && (share->magic == 0x7e117a1e)) {
    if (share->lockfunc != (curl_lock_function)0x0) {
      (*share->lockfunc)((CURL *)0x0,CURL_LOCK_DATA_SHARE,CURL_LOCK_ACCESS_SINGLE,share->clientdata)
      ;
    }
    if (share->dirty == 0) {
      if ((share->specifier & 0x20) != 0) {
        Curl_cpool_destroy(&share->cpool);
      }
      Curl_hash_destroy(&share->hostcache);
      Curl_cookie_cleanup(share->cookies);
      Curl_hsts_cleanup(&share->hsts);
      pCVar2 = share->sslsession;
      if (pCVar2 != (Curl_ssl_session *)0x0) {
        if (share->max_ssl_sessions != 0) {
          lVar3 = 0;
          uVar4 = 0;
          do {
            Curl_ssl_kill_session((Curl_ssl_session *)((long)&share->sslsession->name + lVar3));
            uVar4 = uVar4 + 1;
            lVar3 = lVar3 + 0xd0;
          } while (uVar4 < share->max_ssl_sessions);
          pCVar2 = share->sslsession;
        }
        (*Curl_cfree)(pCVar2);
      }
      Curl_psl_destroy(&share->psl);
      if (share->unlockfunc != (curl_unlock_function)0x0) {
        (*share->unlockfunc)((CURL *)0x0,CURL_LOCK_DATA_SHARE,share->clientdata);
      }
      share->magic = 0;
      (*Curl_cfree)(share);
      CVar1 = CURLSHE_OK;
    }
    else {
      CVar1 = CURLSHE_IN_USE;
      if (share->unlockfunc != (curl_unlock_function)0x0) {
        (*share->unlockfunc)((CURL *)0x0,CURL_LOCK_DATA_SHARE,share->clientdata);
      }
    }
  }
  return CVar1;
}

Assistant:

CURLSHcode
curl_share_cleanup(struct Curl_share *share)
{
  if(!GOOD_SHARE_HANDLE(share))
    return CURLSHE_INVALID;

  if(share->lockfunc)
    share->lockfunc(NULL, CURL_LOCK_DATA_SHARE, CURL_LOCK_ACCESS_SINGLE,
                    share->clientdata);

  if(share->dirty) {
    if(share->unlockfunc)
      share->unlockfunc(NULL, CURL_LOCK_DATA_SHARE, share->clientdata);
    return CURLSHE_IN_USE;
  }

  if(share->specifier & (1 << CURL_LOCK_DATA_CONNECT)) {
    Curl_cpool_destroy(&share->cpool);
  }
  Curl_hash_destroy(&share->hostcache);

#if !defined(CURL_DISABLE_HTTP) && !defined(CURL_DISABLE_COOKIES)
  Curl_cookie_cleanup(share->cookies);
#endif

#ifndef CURL_DISABLE_HSTS
  Curl_hsts_cleanup(&share->hsts);
#endif

#ifdef USE_SSL
  if(share->sslsession) {
    size_t i;
    for(i = 0; i < share->max_ssl_sessions; i++)
      Curl_ssl_kill_session(&(share->sslsession[i]));
    free(share->sslsession);
  }
#endif

  Curl_psl_destroy(&share->psl);

  if(share->unlockfunc)
    share->unlockfunc(NULL, CURL_LOCK_DATA_SHARE, share->clientdata);
  share->magic = 0;
  free(share);

  return CURLSHE_OK;
}